

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void EmitReference(ParseNode *pnode,ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo)

{
  OpCode OVar1;
  Symbol *this;
  bool bVar2;
  ParseNodeBin *pPVar3;
  ParseNodeCall *pPVar4;
  ParseNodeName *pPVar5;
  
  OVar1 = pnode->nop;
  if (OVar1 < knopNew) {
    if (OVar1 == knopName) {
      return;
    }
    if (OVar1 != knopCall) {
      if (OVar1 == knopDot) {
        pPVar3 = ParseNode::AsParseNodeBin(pnode);
        pnode = pPVar3->pnode1;
      }
      goto LAB_0080be02;
    }
  }
  else {
    if (knopTryFinally < OVar1) {
      if (OVar1 == knopObjectPattern) {
        return;
      }
      if (OVar1 == knopArrayPattern) {
        return;
      }
      goto LAB_0080be02;
    }
    if (OVar1 != knopNew) {
      if (OVar1 == knopIndex) {
        pPVar3 = ParseNode::AsParseNodeBin(pnode);
        Emit(pPVar3->pnode1,byteCodeGenerator,funcInfo,0,false,false);
        pPVar3 = ParseNode::AsParseNodeBin(pnode);
        pnode = pPVar3->pnode2;
      }
      goto LAB_0080be02;
    }
  }
  pPVar4 = ParseNode::AsParseNodeCall(pnode);
  if ((pPVar4->field_0x24 & 8) == 0) {
    pPVar4 = ParseNode::AsParseNodeCall(pnode);
    OVar1 = pPVar4->pnodeTarget->nop;
    if (OVar1 == knopName) {
      pPVar4 = ParseNode::AsParseNodeCall(pnode);
      pPVar5 = ParseNode::AsParseNodeName(pPVar4->pnodeTarget);
      this = pPVar5->sym;
      if (this == (Symbol *)0x0) {
        pPVar4 = ParseNode::AsParseNodeCall(pnode);
        FuncInfo::AcquireLoc(funcInfo,pPVar4->pnodeTarget);
      }
      else {
        if (this->location == 0xffffffff) {
          pPVar4 = ParseNode::AsParseNodeCall(pnode);
          FuncInfo::AcquireLoc(funcInfo,pPVar4->pnodeTarget);
        }
        bVar2 = Symbol::IsInSlot(this,byteCodeGenerator,funcInfo,false);
        if ((bVar2) || (this->scope->func != funcInfo)) goto LAB_0080bedb;
      }
      pPVar4 = ParseNode::AsParseNodeCall(pnode);
      pPVar5 = ParseNode::AsParseNodeName(pPVar4->pnodeTarget);
      EmitUseBeforeDeclaration(pPVar5->sym,byteCodeGenerator,funcInfo);
    }
    else {
      if ((OVar1 != knopIndex) && (OVar1 != knopDot)) {
LAB_0080bedb:
        pPVar4 = ParseNode::AsParseNodeCall(pnode);
        EmitLoad(pPVar4->pnodeTarget,byteCodeGenerator,funcInfo);
        goto LAB_0080bef2;
      }
      pPVar4 = ParseNode::AsParseNodeCall(pnode);
      FuncInfo::AcquireLoc(funcInfo,pPVar4->pnodeTarget);
    }
    pPVar4 = ParseNode::AsParseNodeCall(pnode);
    EmitReference(pPVar4->pnodeTarget,byteCodeGenerator,funcInfo);
  }
LAB_0080bef2:
  pPVar4 = ParseNode::AsParseNodeCall(pnode);
  if (pPVar4->pnodeArgs == (ParseNodePtr)0x0) {
    return;
  }
  pPVar4 = ParseNode::AsParseNodeCall(pnode);
  while (pnode = pPVar4->pnodeArgs, pnode->nop == knopList) {
    pPVar3 = ParseNode::AsParseNodeBin(pnode);
    Emit(pPVar3->pnode1,byteCodeGenerator,funcInfo,0,false,false);
    pPVar4 = (ParseNodeCall *)ParseNode::AsParseNodeBin(pnode);
  }
LAB_0080be02:
  Emit(pnode,byteCodeGenerator,funcInfo,0,false,false);
  return;
}

Assistant:

void EmitReference(ParseNode *pnode, ByteCodeGenerator *byteCodeGenerator, FuncInfo *funcInfo)
{
    // Generate code for the LHS of an assignment.
    switch (pnode->nop)
    {
    case knopDot:
        Emit(pnode->AsParseNodeBin()->pnode1, byteCodeGenerator, funcInfo, false);
        break;

    case knopIndex:
        Emit(pnode->AsParseNodeBin()->pnode1, byteCodeGenerator, funcInfo, false);
        Emit(pnode->AsParseNodeBin()->pnode2, byteCodeGenerator, funcInfo, false);
        break;

    case knopName:
        break;

    case knopArrayPattern:
    case knopObjectPattern:
        break;

    case knopCall:
    case knopNew:
        // Emit the operands of a call that will be used as a LHS.
        // These have to be emitted before the RHS, but they have to persist until
        // the end of the expression.
        // Emit the call target operands first.
        // The call target does not need to be emitted for a super call - EmitSuperCall will do this.
        if (!pnode->AsParseNodeCall()->isSuperCall)
        {
            switch (pnode->AsParseNodeCall()->pnodeTarget->nop)
            {
            case knopDot:
            case knopIndex:
                funcInfo->AcquireLoc(pnode->AsParseNodeCall()->pnodeTarget);
                EmitReference(pnode->AsParseNodeCall()->pnodeTarget, byteCodeGenerator, funcInfo);
                break;

            case knopName:
            {
                Symbol* sym = pnode->AsParseNodeCall()->pnodeTarget->AsParseNodeName()->sym;
                if (!sym || sym->GetLocation() == Js::Constants::NoRegister)
                {
                    funcInfo->AcquireLoc(pnode->AsParseNodeCall()->pnodeTarget);
                }
                if (sym && (sym->IsInSlot(byteCodeGenerator, funcInfo) || sym->GetScope()->GetFunc() != funcInfo))
                {
                    // Can't get the value from the assigned register, so load it here.
                    EmitLoad(pnode->AsParseNodeCall()->pnodeTarget, byteCodeGenerator, funcInfo);
                }
                else
                {
                    // EmitLoad will check for needsDeclaration and emit the Use Before Declaration error
                    // bytecode op as necessary, but EmitReference does not check this (by design). So we
                    // must manually check here.
                    EmitUseBeforeDeclaration(pnode->AsParseNodeCall()->pnodeTarget->AsParseNodeName()->sym, byteCodeGenerator, funcInfo);
                    EmitReference(pnode->AsParseNodeCall()->pnodeTarget, byteCodeGenerator, funcInfo);
                }
                break;
            }
            default:
                EmitLoad(pnode->AsParseNodeCall()->pnodeTarget, byteCodeGenerator, funcInfo);
                break;
            }
        }

        // Now the arg list. We evaluate everything now and emit the ArgOut's later.
        if (pnode->AsParseNodeCall()->pnodeArgs)
        {
            ParseNode *pnodeArg = pnode->AsParseNodeCall()->pnodeArgs;
            while (pnodeArg->nop == knopList)
            {
                Emit(pnodeArg->AsParseNodeBin()->pnode1, byteCodeGenerator, funcInfo, false);
                pnodeArg = pnodeArg->AsParseNodeBin()->pnode2;
            }
            Emit(pnodeArg, byteCodeGenerator, funcInfo, false);
        }
        break;

    default:
        Emit(pnode, byteCodeGenerator, funcInfo, false);
        break;
    }
}